

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coolprop_tracer.h
# Opt level: O3

stepping_variable __thiscall
PyVLEIsolineTracer<double>::determine_integration_type(PyVLEIsolineTracer<double> *this)

{
  stepping_variable unaff_EBP;
  function overload;
  object o;
  gil_scoped_release release;
  gil_scoped_acquire gil;
  gil_scoped_acquire acquire;
  handle local_58;
  object local_50;
  gil_scoped_release local_48;
  gil_scoped_acquire local_38;
  gil_scoped_acquire local_28;
  
  local_48.disassoc = false;
  pybind11::detail::get_internals();
  local_48.tstate = (PyThreadState *)PyEval_SaveThread();
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_28);
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_38);
  pybind11::get_overload<VLEIsolineTracer<double>>
            ((pybind11 *)&local_58,&this->super_VLEIsolineTracer<double>,
             "determine_integration_type");
  if (local_58.m_ptr != (PyObject *)0x0) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_50);
    unaff_EBP = pybind11::cast<AbstractIsolineTracer<double>::stepping_variable>(&local_50);
    pybind11::object::~object(&local_50);
  }
  pybind11::object::~object((object *)&local_58);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_38);
  if (local_58.m_ptr == (PyObject *)0x0) {
    unaff_EBP = AbstractIsolineTracer<double>::determine_integration_type
                          ((AbstractIsolineTracer<double> *)this);
  }
  pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_28);
  pybind11::gil_scoped_release::~gil_scoped_release(&local_48);
  return unaff_EBP;
}

Assistant:

stepping_variable determine_integration_type() override{
        // Release the GIL
        py::gil_scoped_release release;
        {
            // Acquire GIL before calling Python code
            py::gil_scoped_acquire acquire;

            // Parameters to macro are: Return type, parent class, name of function in C++, argument(s)
            PYBIND11_OVERLOAD(stepping_variable,
                VLEIsolineTracer,
                determine_integration_type,
                // No arguments
                );
        }
    }